

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
set_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (xpression_peeker<char> *this,
          regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  void *pvVar1;
  char *__s1;
  hash_peek_bitset<char> *phVar2;
  char cVar3;
  int iVar4;
  
  pvVar1 = this->traits_;
  if (pvVar1 == (void *)0x0) {
    this->traits_ = tr;
    this->traits_type_ =
         (type_info *)&regex_traits<char,boost::xpressive::cpp_regex_traits<char>>::typeinfo;
    return;
  }
  __s1 = *(char **)(this->traits_type_ + 8);
  if (((__s1 == "N5boost9xpressive12regex_traitsIcNS0_16cpp_regex_traitsIcEEEE") ||
      ((*__s1 != '*' &&
       (iVar4 = strcmp(__s1,"N5boost9xpressive12regex_traitsIcNS0_16cpp_regex_traitsIcEEEE"),
       iVar4 == 0)))) &&
     (cVar3 = std::locale::operator==
                        ((locale *)((long)pvVar1 + 0x200),&(tr->super_cpp_regex_traits<char>).loc_),
     cVar3 != '\0')) {
    return;
  }
  phVar2 = this->bset_;
  phVar2->icase_ = false;
  *(undefined4 *)(phVar2->bset_).super__Base_bitset<4UL>._M_w = 0xffffffff;
  *(undefined4 *)((long)(phVar2->bset_).super__Base_bitset<4UL>._M_w + 4) = 0xffffffff;
  *(undefined4 *)((phVar2->bset_).super__Base_bitset<4UL>._M_w + 1) = 0xffffffff;
  *(undefined4 *)((long)(phVar2->bset_).super__Base_bitset<4UL>._M_w + 0xc) = 0xffffffff;
  *(undefined4 *)((phVar2->bset_).super__Base_bitset<4UL>._M_w + 2) = 0xffffffff;
  *(undefined4 *)((long)(phVar2->bset_).super__Base_bitset<4UL>._M_w + 0x14) = 0xffffffff;
  *(undefined4 *)((phVar2->bset_).super__Base_bitset<4UL>._M_w + 3) = 0xffffffff;
  *(undefined4 *)((long)(phVar2->bset_).super__Base_bitset<4UL>._M_w + 0x1c) = 0xffffffff;
  return;
}

Assistant:

void set_traits(Traits const &tr)
    {
        if(0 == this->traits_)
        {
            this->traits_ = &tr;
            this->traits_type_ = &typeid(Traits);
        }
        else if(*this->traits_type_ != typeid(Traits) || this->get_traits_<Traits>() != tr)
        {
            this->fail(); // traits mis-match! set all and bail
        }
    }